

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_moveto(FT_Vector *to,void *closure)

{
  FT_Pos FVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  
  if (*(char *)((long)closure + 10) == '\x01') {
    cVar2 = (**(code **)(*closure + 0x28))(closure);
    uVar4 = 1;
    if (cVar2 == '\0') goto LAB_001b48c7;
  }
  bVar3 = (**(code **)(*closure + 0x10))(closure,(int)(short)to->x,(int)(short)to->y);
  uVar4 = (uint)(bVar3 ^ 1);
LAB_001b48c7:
  FVar1 = to->y;
  *(FT_Pos *)((long)closure + 0x10) = to->x;
  *(FT_Pos *)((long)closure + 0x18) = FVar1;
  *(undefined1 *)((long)closure + 10) = 1;
  return uVar4;
}

Assistant:

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_moveto(const FT_Vector* to, void *closure) //static
{
	return ( (FreeTypeFaceWrapper::IOutlineEnumerator *)closure )->FTMoveto(to) ? 0 : 1;
}